

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<std::unordered_set<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>,std::unordered_set<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
          *lhs,unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
               *rhs)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_70;
  string local_50;
  internal *local_30;
  unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  *rhs_local;
  unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  local_30 = (internal *)rhs;
  rhs_local = lhs;
  lhs_local = (unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
               *)rhs_expression;
  rhs_expression_local = lhs_expression;
  lhs_expression_local = (char *)this;
  FormatForComparisonFailureMessage<std::unordered_set<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>,std::unordered_set<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>>
            (&local_50,(internal *)lhs,rhs,lhs);
  FormatForComparisonFailureMessage<std::unordered_set<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>,std::unordered_set<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>>
            (&local_70,local_30,rhs_local,lhs);
  testing::internal::EqFailure
            ((char *)this,lhs_expression,(string *)rhs_expression,(string *)&local_50,
             SUB81(&local_70,0));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  AVar1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}